

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueStart(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_START,OperationSet);
  (pFVar1->Data).SetEffectParameters.EffectIndex = Flags;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueStart(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_START,
		OperationSet
	);

	op->Data.Start.Flags = Flags;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}